

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O0

void __thiscall
level_aux_mesh::build(level_aux_mesh *this,xr_level_som *som,xr_gamemtls_lib *gamemtls_lib)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  xr_gamemtl_vec *__x;
  iterator iVar4;
  iterator iVar5;
  reference ppxVar6;
  som_poly *psVar7;
  __normal_iterator<xray_re::xr_gamemtl_**,_std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>_>
  local_188 [2];
  undefined1 *local_178;
  xr_gamemtl **local_170;
  xr_gamemtl **local_168;
  __normal_iterator<xray_re::xr_gamemtl_**,_std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>_>
  local_160;
  __normal_iterator<xray_re::xr_gamemtl_*const_*,_std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>_>
  local_158;
  xr_gamemtl_vec_cit gamemtl_it;
  som_poly *end;
  som_poly *it;
  b_face face_template;
  vector<unsigned_int,_std::allocator<unsigned_int>_> refs;
  undefined1 local_d8 [4];
  uint32_t face_idx;
  xr_gamemtl pattern;
  undefined1 local_38 [8];
  xr_gamemtl_vec gamemtls;
  xr_gamemtls_lib *gamemtls_lib_local;
  xr_level_som *som_local;
  level_aux_mesh *this_local;
  
  gamemtls.super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)gamemtls_lib;
  __x = xray_re::xr_gamemtls_lib::materials(gamemtls_lib);
  std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::vector
            ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_> *)local_38,__x);
  iVar4 = std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::begin
                    ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_> *)
                     local_38);
  iVar5 = std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::end
                    ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_> *)
                     local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<xray_re::xr_gamemtl**,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>,sound_occ_pred>
            (iVar4._M_current,iVar5._M_current);
  xray_re::xr_gamemtl::xr_gamemtl((xr_gamemtl *)local_d8);
  refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag);
  uVar3 = xray_re::xr_level_som::num_polys(som);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag,
             (ulong)(uVar3 * 3));
  uVar3 = xray_re::xr_level_som::num_polys(som);
  std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
  reserve(&(this->super_xr_mesh_builder).m_faces,(ulong)uVar3);
  xray_re::xr_mesh_builder::b_face::b_face((b_face *)&it);
  end = xray_re::xr_level_som::polys(som);
  uVar3 = xray_re::xr_level_som::num_polys(som);
  psVar7 = end + uVar3;
  do {
    if (end == psVar7) {
      if (refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        psVar7 = xray_re::xr_level_som::polys(som);
        compact_vertices<xray_re::som_poly>
                  (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag,
                   psVar7);
        create_uvs(this);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag);
      xray_re::xr_gamemtl::~xr_gamemtl((xr_gamemtl *)local_d8);
      std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::~vector
                ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_> *)local_38);
      return;
    }
    bVar1 = xray_re::_vector3<float>::operator==((_vector3<float> *)end,&(end->field_0).field_0.v1);
    if (((!bVar1) &&
        (bVar1 = xray_re::_vector3<float>::operator==
                           ((_vector3<float> *)end,&(end->field_0).field_0.v2), !bVar1)) &&
       (bVar1 = xray_re::_vector3<float>::operator==
                          (&(end->field_0).field_0.v1,&(end->field_0).field_0.v2), !bVar1)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag,
                 (value_type_conflict2 *)
                 ((long)&refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      gamemtl_it._M_current._4_4_ =
           refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ | 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag,
                 (value_type_conflict2 *)((long)&gamemtl_it._M_current + 4));
      gamemtl_it._M_current._0_4_ =
           refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&face_template.tag,
                 (value_type_conflict2 *)&gamemtl_it);
      refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 4;
      pattern.bounce_damage_factor = end->occ;
      local_168 = (xr_gamemtl **)
                  std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::begin
                            ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                              *)local_38);
      local_170 = (xr_gamemtl **)
                  std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::end
                            ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                              *)local_38);
      local_178 = local_d8;
      local_160 = std::
                  lower_bound<__gnu_cxx::__normal_iterator<xray_re::xr_gamemtl**,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>,xray_re::xr_gamemtl*,sound_occ_pred>
                            (local_168,local_170,&local_178);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_gamemtl*const*,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>
      ::__normal_iterator<xray_re::xr_gamemtl**>
                ((__normal_iterator<xray_re::xr_gamemtl*const*,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>
                  *)&local_158,&local_160);
      local_188[0]._M_current =
           (xr_gamemtl **)
           std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::end
                     ((vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_> *)
                      local_38);
      bVar2 = __gnu_cxx::operator!=(&local_158,local_188);
      bVar1 = false;
      if (bVar2) {
        ppxVar6 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_gamemtl_*const_*,_std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>_>
                  ::operator*(&local_158);
        bVar1 = (*ppxVar6)->snd_occlusion_factor == end->occ;
      }
      if (!bVar1) {
        __assert_fail("gamemtl_it != gamemtls.end() && (*gamemtl_it)->snd_occlusion_factor == it->occ"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_aux_mesh.cxx"
                      ,0x62,
                      "void level_aux_mesh::build(const xr_level_som &, const xr_gamemtls_lib &)");
      }
      ppxVar6 = __gnu_cxx::
                __normal_iterator<xray_re::xr_gamemtl_*const_*,_std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>_>
                ::operator*(&local_158);
      xray_re::xr_raw_surface::set
                ((xr_raw_surface *)((long)&face_template.field_0 + 0x28),0,0,
                 (uint16_t)(*ppxVar6)->id,(ushort)(end->b2sided != 0) << 3);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      push_back(&(this->super_xr_mesh_builder).m_faces,(value_type *)&it);
    }
    end = end + 1;
  } while( true );
}

Assistant:

void level_aux_mesh::build(const xr_level_som& som, const xr_gamemtls_lib& gamemtls_lib)
{
	xr_gamemtl_vec gamemtls(gamemtls_lib.materials());
	std::sort(gamemtls.begin(), gamemtls.end(), sound_occ_pred());

	xr_gamemtl pattern;

	uint32_t face_idx = 0;

	std::vector<uint32_t> refs;
	refs.reserve(3*som.num_polys());
	m_faces.reserve(som.num_polys());
	b_face face_template;
	for (const som_poly *it = som.polys(), *end = it + som.num_polys(); it != end; ++it) {
		if (it->v0 == it->v1 || it->v0 == it->v2 || it->v1 == it->v2)
			continue;
		refs.push_back(face_idx);
		refs.push_back(face_idx | 1);
		refs.push_back(face_idx | 2);
		face_idx += 4;
		pattern.snd_occlusion_factor = it->occ;
		xr_gamemtl_vec_cit gamemtl_it = std::lower_bound(gamemtls.begin(), gamemtls.end(),
				&pattern, sound_occ_pred());
		xr_assert(gamemtl_it != gamemtls.end() && (*gamemtl_it)->snd_occlusion_factor == it->occ);
		face_template.surface.set(0, 0, (*gamemtl_it)->id, it->b2sided ? RSF_TWO_SIDED : 0);
		m_faces.push_back(face_template);
	}
	if (face_idx) {
		compact_vertices(refs, som.polys());
		create_uvs();
	}
}